

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

CheckedError __thiscall flatbuffers::Parser::ParseDecl(Parser *this,char *filename)

{
  SymbolTable<flatbuffers::Value> *this_00;
  FieldDef *pFVar1;
  __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  __first;
  char cVar2;
  StructDef *struct_def_00;
  bool bVar3;
  bool bVar4;
  voffset_t vVar5;
  Value *pVVar6;
  pointer ppFVar7;
  Type *e;
  pointer ppFVar8;
  char *in_RDX;
  long lVar9;
  int t;
  __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  __last;
  string *this_01;
  StructDef *name_00;
  iterator it;
  FieldDef **ppFVar10;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar11;
  voffset_t id;
  string qualified_name;
  string local_128;
  StructDef *local_108;
  Value *local_100;
  StructDef *local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  StructDef *struct_def;
  string name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dc;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&dc,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(filename + 0x48));
  bVar3 = IsIdent((Parser *)filename,"struct");
  if (bVar3) {
LAB_0011186d:
    Next(this);
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00111a59;
    CheckedError::~CheckedError((CheckedError *)this);
    std::__cxx11::string::string((string *)&name,(string *)(filename + 0x28));
    t = (int)filename;
    Expect(this,t);
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
      CheckedError::~CheckedError((CheckedError *)this);
      StartStruct(this,(string *)filename,(StructDef **)&name);
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
        CheckedError::~CheckedError((CheckedError *)this);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(&(struct_def->super_Definition).doc_comment,&dc);
        struct_def->fixed = bVar3;
        if ((in_RDX != (char *)0x0) && (*(long *)(filename + 0x628) != 0)) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_128,in_RDX,(allocator<char> *)&local_f0);
          FilePath(&qualified_name,(string *)(filename + 0x620),&local_128,(bool)filename[0x4e4]);
          pVar11 = std::
                   _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                   ::_M_insert_unique<std::__cxx11::string_const&>
                             ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                               *)(filename + 0x748),&qualified_name);
          (struct_def->super_Definition).declaration_file =
               (string *)(pVar11.first._M_node._M_node + 1);
          std::__cxx11::string::~string((string *)&qualified_name);
          std::__cxx11::string::~string((string *)&local_128);
        }
        this_00 = &(struct_def->super_Definition).attributes;
        ParseMetaData(this,(SymbolTable<flatbuffers::Value> *)filename);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
          CheckedError::~CheckedError((CheckedError *)this);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&qualified_name,"original_order",(allocator<char> *)&local_128);
          pVVar6 = SymbolTable<flatbuffers::Value>::Lookup(this_00,&qualified_name);
          struct_def->sortbysize = !bVar3 && pVVar6 == (Value *)0x0;
          std::__cxx11::string::~string((string *)&qualified_name);
          Expect(this,t);
          while( true ) {
            *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
            if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00111a4c;
            CheckedError::~CheckedError((CheckedError *)this);
            if (*(int *)(filename + 0x1c) == 0x7d) break;
            ParseField(this,(StructDef *)filename);
          }
          if (bVar3) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&qualified_name,"force_align",(allocator<char> *)&local_128);
            pVVar6 = SymbolTable<flatbuffers::Value>::Lookup(this_00,&qualified_name);
            std::__cxx11::string::~string((string *)&qualified_name);
            if (pVVar6 != (Value *)0x0) {
              ParseAlignAttribute(this,(string *)filename,(size_t)&pVVar6->constant,
                                  (size_t *)struct_def->minalign);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00111a4c;
              CheckedError::~CheckedError((CheckedError *)this);
              struct_def->minalign =
                   CONCAT62(qualified_name._M_dataplus._M_p._2_6_,
                            CONCAT11(qualified_name._M_dataplus._M_p._1_1_,
                                     (char)qualified_name._M_dataplus._M_p));
            }
            if (struct_def->bytesize == 0) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&qualified_name,"size 0 structs not allowed",
                         (allocator<char> *)&local_128);
              Error(this,(string *)filename);
              goto LAB_00111f0e;
            }
          }
          StructDef::PadLastField(struct_def,struct_def->minalign);
          local_f8 = (StructDef *)&(struct_def->fields).vec;
          local_108 = struct_def;
          name_00 = struct_def;
          if (bVar3) goto LAB_00111cb7;
          ppFVar10 = (struct_def->fields).vec.
                     super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          __last._M_current =
               (struct_def->fields).vec.
               super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (__last._M_current == ppFVar10) goto LAB_00111cb7;
          lVar9 = 0;
          for (; name_00 = local_108, ppFVar10 != __last._M_current; ppFVar10 = ppFVar10 + 1) {
            pFVar1 = *ppFVar10;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&qualified_name,"id",(allocator<char> *)&local_128);
            pVVar6 = SymbolTable<flatbuffers::Value>::Lookup
                               (&(pFVar1->super_Definition).attributes,&qualified_name);
            std::__cxx11::string::~string((string *)&qualified_name);
            lVar9 = (lVar9 + 1) - (ulong)(pVVar6 == (Value *)0x0);
            __last._M_current =
                 (local_108->fields).vec.
                 super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
          }
          if ((lVar9 == 0) && (filename[0x67c] != '\x01')) {
LAB_00111cb7:
            struct_def_00 = local_f8;
            CheckClash(this,(vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                             *)filename,local_f8,(char *)name_00,0x141d84);
            *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
            if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
              CheckedError::~CheckedError((CheckedError *)this);
              CheckClash(this,(vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                               *)filename,struct_def_00,(char *)name_00,0x140fd9);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
                CheckedError::~CheckedError((CheckedError *)this);
                CheckClash(this,(vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                                 *)filename,struct_def_00,(char *)name_00,0x140fde);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
                  CheckedError::~CheckedError((CheckedError *)this);
                  CheckClash(this,(vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                                   *)filename,struct_def_00,(char *)name_00,0x14337e);
                  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                  if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
                    CheckedError::~CheckedError((CheckedError *)this);
                    CheckClash(this,(vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                                     *)filename,struct_def_00,(char *)name_00,0x140fe6);
                    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                    if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
                      CheckedError::~CheckedError((CheckedError *)this);
                      CheckClash(this,(vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                                       *)filename,struct_def_00,(char *)name_00,0x140ff3);
                      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                      if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
                        CheckedError::~CheckedError((CheckedError *)this);
                        Expect(this,t);
                        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                        if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
                          CheckedError::~CheckedError((CheckedError *)this);
                          Namespace::GetFullyQualifiedName
                                    (&qualified_name,*(Namespace **)(filename + 0x198),
                                     (string *)name_00,1000);
                          e = (Type *)operator_new(0x20);
                          e->base_type = BASE_TYPE_STRUCT;
                          e->element = BASE_TYPE_NONE;
                          e->struct_def = local_108;
                          e->enum_def = (EnumDef *)0x0;
                          e->fixed_length = 0;
                          bVar3 = SymbolTable<flatbuffers::Type>::Add
                                            ((SymbolTable<flatbuffers::Type> *)(filename + 0x60),
                                             &qualified_name,e);
                          if (bVar3) {
                            std::operator+(&local_128,"datatype already exists: ",&qualified_name);
                            Error(this,(string *)filename);
                            std::__cxx11::string::~string((string *)&local_128);
                          }
                          else {
                            *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
                          }
                          goto LAB_00111f0e;
                        }
                      }
                    }
                  }
                }
              }
            }
            goto LAB_00111a4c;
          }
          __first._M_current = (FieldDef **)(local_f8->super_Definition).name._M_dataplus._M_p;
          if (lVar9 == (long)__last._M_current - (long)__first._M_current >> 3) {
            std::
            __sort<__gnu_cxx::__normal_iterator<flatbuffers::FieldDef**,std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(flatbuffers::FieldDef_const*,flatbuffers::FieldDef_const*)>>
                      (__first,__last,
                       (_Iter_comp_iter<bool_(*)(const_flatbuffers::FieldDef_*,_const_flatbuffers::FieldDef_*)>
                        )0x1121c4);
            ppFVar7 = (name_00->fields).vec.
                      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            ppFVar8 = (name_00->fields).vec.
                      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            if (0x7fff8 < (ulong)((long)ppFVar8 - (long)ppFVar7)) {
              __assert_fail("fields.size() <= flatbuffers::numeric_limits<voffset_t>::max()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_parser.cpp"
                            ,0xaf8,"CheckedError flatbuffers::Parser::ParseDecl(const char *)");
            }
            lVar9 = 0;
            while( true ) {
              if (((uint)((int)ppFVar8 - (int)ppFVar7) >> 3 & 0xffff) <= (uint)lVar9)
              goto LAB_00111cb7;
              pFVar1 = ppFVar7[lVar9];
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&qualified_name,"id",(allocator<char> *)&local_128);
              pVVar6 = SymbolTable<flatbuffers::Value>::Lookup
                                 (&(pFVar1->super_Definition).attributes,&qualified_name);
              std::__cxx11::string::~string((string *)&qualified_name);
              id = 0;
              local_100 = pVVar6;
              anon_unknown_0::atot<unsigned_short>
                        ((anon_unknown_0 *)&qualified_name,(pVVar6->constant)._M_dataplus._M_p,
                         (Parser *)filename,&id);
              cVar2 = (char)qualified_name._M_dataplus._M_p;
              qualified_name._M_dataplus._M_p._1_1_ = 1;
              CheckedError::~CheckedError((CheckedError *)&qualified_name);
              if (cVar2 == '\x01') break;
              vVar5 = (voffset_t)lVar9;
              if (vVar5 != id) {
                NumToString<unsigned_short>(&local_90,vVar5);
                std::operator+(&local_70,"field id\'s must be consecutive from 0, id ",&local_90);
                pVVar6 = local_100;
                std::operator+(&local_50,&local_70," missing or set twice, field: ");
                std::operator+(&local_f0,&local_50,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               pFVar1);
                std::operator+(&local_128,&local_f0,", id: ");
                std::operator+(&qualified_name,&local_128,&pVVar6->constant);
                Error(this,(string *)filename);
                std::__cxx11::string::~string((string *)&qualified_name);
                std::__cxx11::string::~string((string *)&local_128);
                std::__cxx11::string::~string((string *)&local_f0);
                std::__cxx11::string::~string((string *)&local_50);
                std::__cxx11::string::~string((string *)&local_70);
                this_01 = &local_90;
                goto LAB_00111f13;
              }
              vVar5 = FieldIndexToOffset(vVar5);
              (pFVar1->value).offset = vVar5;
              ppFVar7 = (local_108->fields).vec.
                        super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              ppFVar8 = (local_108->fields).vec.
                        super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              lVar9 = lVar9 + 1;
              name_00 = local_108;
            }
            std::operator+(&local_f0,"field id\'s must be non-negative number, field: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           pFVar1);
            std::operator+(&local_128,&local_f0,", id: ");
            std::operator+(&qualified_name,&local_128,&local_100->constant);
            Error(this,(string *)filename);
            std::__cxx11::string::~string((string *)&qualified_name);
            std::__cxx11::string::~string((string *)&local_128);
            this_01 = &local_f0;
          }
          else {
            if (filename[0x67c] == '\x01') {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&qualified_name,
                         "all fields must have an \'id\' attribute when --require-explicit-ids is used"
                         ,(allocator<char> *)&local_128);
              Error(this,(string *)filename);
            }
            else {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&qualified_name,
                         "either all fields or no fields must have an \'id\' attribute",
                         (allocator<char> *)&local_128);
              Error(this,(string *)filename);
            }
LAB_00111f0e:
            this_01 = &qualified_name;
          }
LAB_00111f13:
          std::__cxx11::string::~string((string *)this_01);
        }
      }
    }
  }
  else {
    bVar4 = IsIdent((Parser *)filename,"table");
    if (bVar4) goto LAB_0011186d;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&name,"declaration expected",(allocator<char> *)&qualified_name);
    Error(this,(string *)filename);
  }
LAB_00111a4c:
  std::__cxx11::string::~string((string *)&name);
LAB_00111a59:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&dc);
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseDecl(const char *filename) {
  std::vector<std::string> dc = doc_comment_;
  bool fixed = IsIdent("struct");
  if (!fixed && !IsIdent("table")) return Error("declaration expected");
  NEXT();
  std::string name = attribute_;
  EXPECT(kTokenIdentifier);
  StructDef *struct_def;
  ECHECK(StartStruct(name, &struct_def));
  struct_def->doc_comment = dc;
  struct_def->fixed = fixed;
  if (filename && !opts.project_root.empty()) {
    struct_def->declaration_file =
        &GetPooledString(FilePath(opts.project_root, filename, opts.binary_schema_absolute_paths));
  }
  ECHECK(ParseMetaData(&struct_def->attributes));
  struct_def->sortbysize =
      struct_def->attributes.Lookup("original_order") == nullptr && !fixed;
  EXPECT('{');
  while (token_ != '}') ECHECK(ParseField(*struct_def));
  if (fixed) {
    const auto force_align = struct_def->attributes.Lookup("force_align");
    if (force_align) {
      size_t align;
      ECHECK(ParseAlignAttribute(force_align->constant, struct_def->minalign,
                                 &align));
      struct_def->minalign = align;
    }
    if (!struct_def->bytesize) return Error("size 0 structs not allowed");
  }
  struct_def->PadLastField(struct_def->minalign);
  // Check if this is a table that has manual id assignments
  auto &fields = struct_def->fields.vec;
  if (!fixed && fields.size()) {
    size_t num_id_fields = 0;
    for (auto it = fields.begin(); it != fields.end(); ++it) {
      if ((*it)->attributes.Lookup("id")) num_id_fields++;
    }
    // If any fields have ids..
    if (num_id_fields || opts.require_explicit_ids) {
      // Then all fields must have them.
      if (num_id_fields != fields.size()) {
        if (opts.require_explicit_ids) {
          return Error(
              "all fields must have an 'id' attribute when "
              "--require-explicit-ids is used");
        } else {
          return Error(
              "either all fields or no fields must have an 'id' attribute");
        }
      }
      // Simply sort by id, then the fields are the same as if no ids had
      // been specified.
      std::sort(fields.begin(), fields.end(), compareFieldDefs);
      // Verify we have a contiguous set, and reassign vtable offsets.
      FLATBUFFERS_ASSERT(fields.size() <=
                         flatbuffers::numeric_limits<voffset_t>::max());
      for (voffset_t i = 0; i < static_cast<voffset_t>(fields.size()); i++) {
        auto &field = *fields[i];
        const auto &id_str = field.attributes.Lookup("id")->constant;

        // Metadata values have a dynamic type, they can be `float`, 'int', or
        // 'string`.
        // The FieldIndexToOffset(i) expects the voffset_t so `id` is limited by
        // this type.
        voffset_t id = 0;
        const auto done = !atot(id_str.c_str(), *this, &id).Check();
        if (!done)
          return Error("field id\'s must be non-negative number, field: " +
                       field.name + ", id: " + id_str);
        if (i != id)
          return Error("field id\'s must be consecutive from 0, id " +
                       NumToString(i) + " missing or set twice, field: " +
                       field.name + ", id: " + id_str);
        field.value.offset = FieldIndexToOffset(i);
      }
    }
  }

  ECHECK(
      CheckClash(fields, struct_def, UnionTypeFieldSuffix(), BASE_TYPE_UNION));
  ECHECK(CheckClash(fields, struct_def, "Type", BASE_TYPE_UNION));
  ECHECK(CheckClash(fields, struct_def, "_length", BASE_TYPE_VECTOR));
  ECHECK(CheckClash(fields, struct_def, "Length", BASE_TYPE_VECTOR));
  ECHECK(CheckClash(fields, struct_def, "_byte_vector", BASE_TYPE_STRING));
  ECHECK(CheckClash(fields, struct_def, "ByteVector", BASE_TYPE_STRING));
  EXPECT('}');
  const auto qualified_name =
      current_namespace_->GetFullyQualifiedName(struct_def->name);
  if (types_.Add(qualified_name,
                 new Type(BASE_TYPE_STRUCT, struct_def, nullptr)))
    return Error("datatype already exists: " + qualified_name);
  return NoError();
}